

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_descriptor_set_layout_ci
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  VkSampler *ppVVar2;
  bool bVar3;
  uint local_3c;
  uint32_t j;
  VkSampler *immutable_samplers;
  VkDescriptorSetLayoutBinding *b;
  uint32_t i;
  VkDescriptorSetLayoutCreateInfo *info_local;
  Impl *this_local;
  
  b._4_4_ = 0;
  do {
    if (info->bindingCount <= b._4_4_) {
      return true;
    }
    pVVar1 = info->pBindings;
    if ((pVVar1[b._4_4_].pImmutableSamplers != (VkSampler *)0x0) &&
       ((pVVar1[b._4_4_].descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
        (pVVar1[b._4_4_].descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)))) {
      ppVVar2 = pVVar1[b._4_4_].pImmutableSamplers;
      for (local_3c = 0; local_3c < pVVar1[b._4_4_].descriptorCount; local_3c = local_3c + 1) {
        bVar3 = remap_sampler_handle(this,ppVVar2[local_3c],ppVVar2 + local_3c);
        if (!bVar3) {
          return false;
        }
      }
    }
    b._4_4_ = b._4_4_ + 1;
  } while( true );
}

Assistant:

bool StateRecorder::Impl::remap_descriptor_set_layout_ci(VkDescriptorSetLayoutCreateInfo *info)
{
	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			auto *immutable_samplers = const_cast<VkSampler *>(b.pImmutableSamplers);
			for (uint32_t j = 0; j < b.descriptorCount; j++)
				if (!remap_sampler_handle(immutable_samplers[j], &immutable_samplers[j]))
					return false;
		}
	}

	return true;
}